

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O2

void ranges::detail::
     final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ranges::less,ranges::identity>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,less *pred,
               identity *proj)

{
  if (0x40 < (long)last._M_current - (long)first._M_current) {
    insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ranges::less,ranges::identity>
              (first,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     (first._M_current + 0x10),pred,proj);
    unguarded_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ranges::less,ranges::identity>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (first._M_current + 0x10),last,pred,proj);
    return;
  }
  insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ranges::less,ranges::identity>
            (first,last,pred,proj);
  return;
}

Assistant:

inline void final_insertion_sort(I first, I last, C & pred, P & proj)
        {
            if(last - first > detail::introsort_threshold())
            {
                detail::insertion_sort(
                    first, first + detail::introsort_threshold(), pred, proj);
                detail::unguarded_insertion_sort(
                    first + detail::introsort_threshold(), last, pred, proj);
            }
            else
                detail::insertion_sort(first, last, pred, proj);
        }